

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdTree.c
# Opt level: O2

Dsd_Node_t * Dsd_TreeNodeCreate(int Type,int nDecs,int BlockNum)

{
  short sVar1;
  Dsd_Node_t *pDVar2;
  Dsd_Node_t **ppDVar3;
  
  sVar1 = (short)nDecs;
  pDVar2 = (Dsd_Node_t *)calloc(1,0x28);
  pDVar2->Type = Type;
  pDVar2->nDecs = sVar1;
  if (sVar1 != 0) {
    ppDVar3 = (Dsd_Node_t **)malloc((long)sVar1 << 3);
    pDVar2->pDecs = ppDVar3;
    *ppDVar3 = (Dsd_Node_t *)0x0;
  }
  return pDVar2;
}

Assistant:

Dsd_Node_t * Dsd_TreeNodeCreate( int Type, int nDecs, int BlockNum )
{
    // allocate memory for this node 
    Dsd_Node_t * p = (Dsd_Node_t *) ABC_ALLOC( char, sizeof(Dsd_Node_t) );
    memset( p, 0, sizeof(Dsd_Node_t) );
    p->Type       = (Dsd_Type_t)Type;       // the type of this block
    p->nDecs      = nDecs;                  // the number of decompositions
    if ( p->nDecs )
    {
        p->pDecs      = (Dsd_Node_t **) ABC_ALLOC( char, p->nDecs * sizeof(Dsd_Node_t *) );
        p->pDecs[0]   = NULL;
    }
    return p;
}